

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_call_detail.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::dispatch::detail::Build_Function_Caller_Helper<chaiscript::Boxed_Value>::call
          (Build_Function_Caller_Helper<chaiscript::Boxed_Value> *this,Function_Params *params,
          Type_Conversions_State *t_state)

{
  Type_Conversions_State *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Boxed_Value BVar1;
  Boxed_Value local_38;
  Type_Conversions_State *local_28;
  Type_Conversions_State *t_state_local;
  Function_Params *params_local;
  Build_Function_Caller_Helper<chaiscript::Boxed_Value> *this_local;
  
  local_28 = in_RCX;
  t_state_local = t_state;
  params_local = params;
  this_local = this;
  dispatch<std::vector<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>,std::allocator<std::shared_ptr<chaiscript::dispatch::Proxy_Function_Base_const>>>>
            ((dispatch *)&local_38,
             (vector<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>,_std::allocator<std::shared_ptr<const_chaiscript::dispatch::Proxy_Function_Base>_>_>
              *)params,(Function_Params *)t_state,in_RCX);
  boxed_cast<chaiscript::Boxed_Value>((chaiscript *)this,&local_38,local_28);
  Boxed_Value::~Boxed_Value(&local_38);
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar1.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Ret call(const chaiscript::Function_Params &params, const Type_Conversions_State &t_state) {
      if constexpr (std::is_arithmetic_v<Ret> && !std::is_same_v<std::remove_cv_t<std::remove_reference_t<Ret>>, bool>) {
        return Boxed_Number(dispatch::dispatch(m_funcs, params, t_state)).get_as<Ret>();
      } else if constexpr (std::is_same_v<void, Ret>) {
        dispatch::dispatch(m_funcs, params, t_state);
      } else {
        return boxed_cast<Ret>(dispatch::dispatch(m_funcs, params, t_state), &t_state);
      }
    }